

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-death-test.cc
# Opt level: O0

int __thiscall testing::internal::ForkingDeathTest::Wait(ForkingDeathTest *this)

{
  bool bVar1;
  int *piVar2;
  DeathTestImpl *in_RDI;
  DeathTestImpl *in_stack_00000060;
  int gtest_retval;
  int status_value;
  allocator *__rhs;
  undefined7 in_stack_fffffffffffffeb8;
  undefined1 uVar3;
  string local_130 [8];
  int *in_stack_fffffffffffffed8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffee0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffee8;
  allocator local_f9;
  string local_f8 [32];
  string local_d8 [32];
  string local_b8 [32];
  string local_98 [32];
  string local_78 [32];
  string local_58 [32];
  string local_38 [32];
  __pid_t local_18;
  int local_14 [4];
  int local_4;
  
  bVar1 = DeathTestImpl::spawned(in_RDI);
  if (bVar1) {
    DeathTestImpl::ReadAndInterpretStatusByte(in_stack_00000060);
    do {
      do {
        local_18 = waitpid(*(__pid_t *)&in_RDI->field_0x2c,local_14,0);
        uVar3 = false;
        if (local_18 == -1) {
          piVar2 = __errno_location();
          uVar3 = *piVar2 == 4;
        }
      } while ((bool)uVar3 != false);
      if (local_18 == -1) {
        __rhs = &local_f9;
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_f8,"CHECK failed: File ",__rhs);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       CONCAT17(uVar3,in_stack_fffffffffffffeb8),(char *)__rhs);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       CONCAT17(uVar3,in_stack_fffffffffffffeb8),(char *)__rhs);
        StreamableToString<int>(in_stack_fffffffffffffed8);
        std::operator+(in_stack_fffffffffffffee8,in_stack_fffffffffffffee0);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       CONCAT17(uVar3,in_stack_fffffffffffffeb8),(char *)__rhs);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       CONCAT17(uVar3,in_stack_fffffffffffffeb8),(char *)__rhs);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       CONCAT17(uVar3,in_stack_fffffffffffffeb8),(char *)__rhs);
        DeathTestAbort((string *)in_RDI);
        std::__cxx11::string::~string(local_38);
        std::__cxx11::string::~string(local_58);
        std::__cxx11::string::~string(local_78);
        std::__cxx11::string::~string(local_98);
        std::__cxx11::string::~string(local_130);
        std::__cxx11::string::~string(local_b8);
        std::__cxx11::string::~string(local_d8);
        std::__cxx11::string::~string(local_f8);
        std::allocator<char>::~allocator((allocator<char> *)&local_f9);
      }
      bVar1 = AlwaysFalse();
    } while (bVar1);
    DeathTestImpl::set_status(in_RDI,local_14[0]);
    local_4 = local_14[0];
  }
  else {
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int ForkingDeathTest::Wait() {
  if (!spawned())
    return 0;

  ReadAndInterpretStatusByte();

  int status_value;
  GTEST_DEATH_TEST_CHECK_SYSCALL_(waitpid(child_pid_, &status_value, 0));
  set_status(status_value);
  return status_value;
}